

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O3

void multest(int base,int test)

{
  clock_t cVar1;
  clock_t cVar2;
  clock_t cVar3;
  clock_t cVar4;
  clock_t cVar5;
  clock_t cVar6;
  int iVar7;
  pointer pBVar8;
  undefined4 in_register_0000003c;
  pointer pBVar9;
  float fVar10;
  vector<BN,_std::allocator<BN>_> v1;
  vector<BN,_std::allocator<BN>_> v2;
  vector<BN,_std::allocator<BN>_> local_c8;
  undefined8 local_b0;
  vector<BN,_std::allocator<BN>_> local_a8;
  BN local_90;
  BN local_78;
  BN local_60;
  BN local_48;
  
  local_b0 = CONCAT44(in_register_0000003c,base);
  local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (BN *)0x0;
  local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (0 < test) {
    iVar7 = test;
    do {
      BN::makeRandom(&local_90,(long)base);
      std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&local_c8,&local_90);
      if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      BN::makeRandom(&local_90,(long)base);
      std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&local_a8,&local_90);
      if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  cVar1 = clock();
  if (local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      != local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pBVar8 = local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar9 = local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      BN::classicMultiplication(&local_48,pBVar9,pBVar8);
      if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pBVar9 = pBVar9 + 1;
      pBVar8 = pBVar8 + 1;
    } while (pBVar9 != local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  cVar2 = clock();
  cVar3 = clock();
  if (local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      != local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pBVar8 = local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar9 = local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      BN::fastMultiplication(&local_60,pBVar9,pBVar8);
      if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pBVar9 = pBVar9 + 1;
      pBVar8 = pBVar8 + 1;
    } while (pBVar9 != local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  cVar4 = clock();
  cVar5 = clock();
  if (local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      != local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pBVar8 = local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar9 = local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      BN::karatsubaMultiplication(&local_78,pBVar9,pBVar8);
      if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pBVar9 = pBVar9 + 1;
      pBVar8 = pBVar8 + 1;
    } while (pBVar9 != local_c8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  cVar6 = clock();
  fVar10 = (float)test;
  printf("%d\t%d\t%d\t%.2f\t\t%.2f\t\t%.2f\n",
         SUB84((double)((float)(ulong)(cVar2 - cVar1) / fVar10),0),
         (double)((float)(ulong)(cVar4 - cVar3) / fVar10),
         (double)((float)(ulong)(cVar6 - cVar5) / fVar10),local_b0,(ulong)(uint)((int)local_b0 * 8))
  ;
  std::vector<BN,_std::allocator<BN>_>::~vector(&local_a8);
  std::vector<BN,_std::allocator<BN>_>::~vector(&local_c8);
  return;
}

Assistant:

void multest(int base,int test)
{
        uint64_t t;
        vector <BN> v1;
        vector <BN> v2;

        for(int i=0;i<test;i++) {
                v1.push_back(BN::makeRandom(base));
                v2.push_back(BN::makeRandom(base));
        }

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->classicMultiplication(*j);
        float t1 = clock() - t;

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->fastMultiplication(*j);
        float t2 = clock() - t;

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->karatsubaMultiplication(*j);
        float t3 = clock() - t;

        float diviser = test;
        t1 /= diviser;
        t2 /= diviser;
        t3 /= diviser;

        printf("%d\t%d\t%d\t%.2f\t\t%.2f\t\t%.2f\n",base,(int)(base*8),(int)test, t1, t2, t3);
}